

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

Mat * RandomMat(Mat *__return_storage_ptr__,int w,int h,int c)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Mat *pMVar5;
  ulong uVar6;
  Mat *pMVar7;
  uint_fast16_t uVar8;
  ulong uVar9;
  bool bVar10;
  
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  ncnn::Mat::create(__return_storage_ptr__,w,h,c,4,(Allocator *)0x0);
  pMVar5 = (Mat *)((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep);
  if (pMVar5 != (Mat *)0x0) {
    pvVar2 = __return_storage_ptr__->data;
    pMVar7 = (Mat *)0x0;
    do {
      uVar8 = g_prng_rand_state.i;
      uVar6 = 0;
      do {
        iVar3 = (int)uVar8;
        iVar4 = (int)uVar6;
        uVar9 = g_prng_rand_state.s[iVar3 + iVar4 + 9U & 0x3f] +
                g_prng_rand_state.s[iVar3 + iVar4 + 0x28U & 0x3f];
        uVar1 = uVar6 + 1;
        g_prng_rand_state.s[iVar3 + iVar4 & 0x3f] = uVar9;
        if (g_prng_rand_state.c != 0) break;
        bVar10 = uVar6 < 0x1ef;
        uVar6 = uVar1;
      } while (bVar10);
      bVar10 = g_prng_rand_state.c == 0;
      g_prng_rand_state.c = g_prng_rand_state.c - 1;
      if (bVar10) {
        g_prng_rand_state.c = 0x36;
      }
      *(float *)((long)pvVar2 + (long)pMVar7 * 4) = (float)uVar9 * 5.421011e-20 * 4.0 + -2.0;
      pMVar7 = (Mat *)((long)&pMVar7->data + 1);
      g_prng_rand_state.i = uVar8 + uVar1;
    } while (pMVar7 != pMVar5);
    g_prng_rand_state.i = uVar8 + uVar1;
  }
  return pMVar5;
}

Assistant:

static ncnn::Mat RandomMat(int w, int h, int c)
{
    ncnn::Mat m(w, h, c);
    Randomize(m);
    return m;
}